

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_class_set_definition_file(coda_product_class *product_class,char *filepath)

{
  char *local_28;
  char *new_definition_file;
  char *filepath_local;
  coda_product_class *product_class_local;
  
  local_28 = (char *)0x0;
  if (product_class->definition_file == (char *)0x0) {
    if ((filepath == (char *)0x0) || (local_28 = strdup(filepath), local_28 != (char *)0x0)) {
      product_class->definition_file = local_28;
      product_class_local._4_4_ = 0;
    }
    else {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                     ,0x2ff);
      product_class_local._4_4_ = -1;
    }
  }
  else {
    coda_set_error(-400,"product class already has a definition file");
    product_class_local._4_4_ = -1;
  }
  return product_class_local._4_4_;
}

Assistant:

int coda_product_class_set_definition_file(coda_product_class *product_class, const char *filepath)
{
    char *new_definition_file = NULL;

    if (product_class->definition_file != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product class already has a definition file");
        return -1;
    }
    if (filepath != NULL)
    {
        new_definition_file = strdup(filepath);
        if (new_definition_file == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }
    product_class->definition_file = new_definition_file;

    return 0;
}